

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_shrinkstack(lua_State *L)

{
  int local_24;
  int local_20;
  int nsize;
  int max;
  int inuse;
  lua_State *L_local;
  
  local_24 = stackinuse(L);
  if (local_24 < 0x51616) {
    local_20 = local_24 * 3;
  }
  else {
    local_20 = 1000000;
  }
  if ((local_24 < 0xf4241) && (local_20 < (int)((long)(L->stack_last).p - (L->stack).offset >> 4)))
  {
    if (local_24 < 0x7a121) {
      local_24 = local_24 << 1;
    }
    else {
      local_24 = 1000000;
    }
    luaD_reallocstack(L,local_24,0);
  }
  luaE_shrinkCI(L);
  return;
}

Assistant:

void luaD_shrinkstack (lua_State *L) {
  int inuse = stackinuse(L);
  int max = (inuse > LUAI_MAXSTACK / 3) ? LUAI_MAXSTACK : inuse * 3;
  /* if thread is currently not handling a stack overflow and its
     size is larger than maximum "reasonable" size, shrink it */
  if (inuse <= LUAI_MAXSTACK && stacksize(L) > max) {
    int nsize = (inuse > LUAI_MAXSTACK / 2) ? LUAI_MAXSTACK : inuse * 2;
    luaD_reallocstack(L, nsize, 0);  /* ok if that fails */
  }
  else  /* don't change stack */
    condmovestack(L,{},{});  /* (change only for debugging) */
  luaE_shrinkCI(L);  /* shrink CI list */
}